

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

void Gla_ManExplorePPis(Gla_Man_t *p,Vec_Int_t *vPPis)

{
  Gla_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Gla_Obj_t *pGVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  
  iVar8 = Gla_ManExplorePPis::Round + 1;
  if (0x33333332 < Gla_ManExplorePPis::Round * -0x33333333 + 0x19999999U) {
    uVar10 = vPPis->nSize;
    uVar11 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar7 = 0;
      Gla_ManExplorePPis::Round = iVar8;
    }
    else {
      piVar4 = vPPis->pArray;
      lVar9 = 0;
      uVar6 = Gla_ManExplorePPis::Round & 1;
      uVar7 = 0;
      Gla_ManExplorePPis::Round = iVar8;
      do {
        iVar8 = piVar4[lVar9];
        lVar12 = (long)iVar8;
        if (lVar12 < 0) {
LAB_0060187e:
          __assert_fail("i >= 0 && i < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                        ,0x6e,"Gla_Obj_t *Gla_ManObj(Gla_Man_t *, int)");
        }
        iVar2 = p->nObjs;
        if (iVar2 <= iVar8) goto LAB_0060187e;
        uVar10 = *(uint *)&p->pObjs[lVar12].field_0x4;
        if ((uVar10 & 1) != 0) {
          __assert_fail("pObj->fAbs == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                        ,0x4fa,"void Gla_ManExplorePPis(Gla_Man_t *, Vec_Int_t *)");
        }
        pGVar1 = p->pObjs + lVar12;
        iVar8 = 0;
        if (0x1ff < uVar10) {
          uVar13 = 0;
          iVar8 = 0;
          do {
            iVar3 = pGVar1->Fanins[uVar13];
            if (((long)iVar3 < 0) || (iVar2 <= iVar3)) goto LAB_0060187e;
            iVar8 = iVar8 + (*(uint *)&p->pObjs[iVar3].field_0x4 & 1);
            uVar13 = uVar13 + 1;
          } while (uVar10 >> 9 != uVar13);
        }
        if ((iVar8 != 0) && (iVar8 != 1 || uVar6 != 0)) {
          pGVar5 = p->pObjs;
          if ((pGVar1 <= pGVar5) || (pGVar5 + iVar2 <= pGVar1)) {
            __assert_fail("pObj > p->pObjs && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                          ,0x6d,"int Gla_ObjId(Gla_Man_t *, Gla_Obj_t *)");
          }
          if (((int)uVar7 < 0) || ((int)uVar11 <= (int)uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          uVar11 = (ulong)uVar7;
          uVar7 = uVar7 + 1;
          piVar4[uVar11] = (int)((ulong)((long)pGVar1 - (long)pGVar5) >> 3) * -0x33333333;
        }
        lVar9 = lVar9 + 1;
        uVar10 = vPPis->nSize;
        uVar11 = (ulong)(int)uVar10;
      } while (lVar9 < (long)uVar11);
    }
    if ((int)uVar10 < (int)uVar7) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    vPPis->nSize = uVar7;
    iVar8 = Gla_ManExplorePPis::Round;
  }
  Gla_ManExplorePPis::Round = iVar8;
  return;
}

Assistant:

void Gla_ManExplorePPis( Gla_Man_t * p, Vec_Int_t * vPPis )
{
    static int Round = 0;
    Gla_Obj_t * pObj, * pFanin;
    int i, j, k, Count;
    if ( (Round++ % 5) == 0 )
        return;
    j = 0;
    Gla_ManForEachObjAbsVec( vPPis, p, pObj, i )
    {
        assert( pObj->fAbs == 0 );
        Count = 0;
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            Count += pFanin->fAbs;
        if ( Count == 0 || ((Round & 1) && Count == 1) )
            continue;
        Vec_IntWriteEntry( vPPis, j++, Gla_ObjId(p, pObj) );
    }
//    printf( "\n%d -> %d\n", Vec_IntSize(vPPis), j );
    Vec_IntShrink( vPPis, j );
}